

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSecondaryViewConfigurationLayerInfoMSFT *value)

{
  pointer *this;
  pointer *this_00;
  bool bVar1;
  XrResult XVar2;
  allocator local_c81;
  string local_c80 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_c60;
  allocator local_c41;
  string local_c40 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_c20;
  allocator local_c01;
  string local_c00 [32];
  __cxx11 local_be0 [39];
  allocator local_bb9;
  string local_bb8 [8];
  string error_message_9;
  XrCompositionLayerPassthroughHTC **new_compositionlayerpassthroughhtc_value;
  allocator local_b71;
  string local_b70 [32];
  __cxx11 local_b50 [39];
  allocator local_b29;
  string local_b28 [8];
  string error_message_8;
  XrCompositionLayerPassthroughFB **new_compositionlayerpassthroughfb_value;
  allocator local_ae1;
  string local_ae0 [32];
  __cxx11 local_ac0 [39];
  allocator local_a99;
  string local_a98 [8];
  string error_message_7;
  XrCompositionLayerEquirect2KHR **new_compositionlayerequirect2khr_value;
  allocator local_a51;
  string local_a50 [32];
  __cxx11 local_a30 [39];
  allocator local_a09;
  string local_a08 [8];
  string error_message_6;
  XrCompositionLayerEquirectKHR **new_compositionlayerequirectkhr_value;
  allocator local_9c1;
  string local_9c0 [32];
  __cxx11 local_9a0 [39];
  allocator local_979;
  string local_978 [8];
  string error_message_5;
  XrCompositionLayerCylinderKHR **new_compositionlayercylinderkhr_value;
  allocator local_931;
  string local_930 [32];
  __cxx11 local_910 [39];
  allocator local_8e9;
  string local_8e8 [8];
  string error_message_4;
  XrCompositionLayerCubeKHR **new_compositionlayercubekhr_value;
  allocator local_8a1;
  string local_8a0 [32];
  __cxx11 local_880 [39];
  allocator local_859;
  string local_858 [8];
  string error_message_3;
  XrCompositionLayerQuad **new_compositionlayerquad_value;
  allocator local_811;
  string local_810 [32];
  __cxx11 local_7f0 [39];
  allocator local_7c9;
  string local_7c8 [8];
  string error_message_2;
  XrCompositionLayerProjection **new_compositionlayerprojection_value;
  allocator local_781;
  string local_780 [32];
  __cxx11 local_760 [39];
  allocator local_739;
  string local_738 [8];
  string error_message_1;
  uint local_718;
  allocator local_711;
  uint32_t value_layers_inc;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_6f0;
  allocator local_6d1;
  string local_6d0 [39];
  allocator local_6a9;
  string local_6a8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_688;
  allocator local_669;
  string local_668 [32];
  string local_648 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_628;
  allocator local_609;
  string local_608 [32];
  string local_5e8 [32];
  ostringstream local_5c8 [8];
  ostringstream oss_enum_1;
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [32];
  string local_400 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3e0;
  allocator local_3c1;
  string local_3c0 [32];
  string local_3a0 [32];
  ostringstream local_380 [8];
  ostringstream oss_enum;
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_190;
  allocator local_171;
  string local_170 [32];
  undefined1 local_150 [40];
  string local_128 [8];
  string error_message;
  allocator local_101;
  string local_100 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_e0;
  allocator local_c1;
  string local_c0 [52];
  NextChainResult local_8c;
  undefined1 local_88 [4];
  NextChainResult next_result;
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrSecondaryViewConfigurationLayerInfoMSFT *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSecondaryViewConfigurationLayerInfoMSFT",
               value->type,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-type-type",
               XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT,
               "XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    this_00 = &encountered_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this_00);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                           *)this_00);
    if (local_8c == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_c0,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-next-next",&local_c1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_e0,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,
                 "Invalid structure(s) in \"next\" chain for XrSecondaryViewConfigurationLayerInfoMSFT struct \"next\""
                 ,&local_101);
      CoreValidLogMessage(instance_info,(string *)local_c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_e0,(string *)local_100);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&local_101);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_e0);
      std::__cxx11::string::~string(local_c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_8c == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_128,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_150 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_150 + 0x27));
      std::__cxx11::string::operator+=(local_128,"XrSecondaryViewConfigurationLayerInfoMSFT : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_150,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_128,(string *)local_150);
      std::__cxx11::string::~string((string *)local_150);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_170,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-next-unique",&local_171);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_190,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1b0,
                 "Multiple structures of the same type(s) in \"next\" chain for XrSecondaryViewConfigurationLayerInfoMSFT struct"
                 ,&local_1b1);
      CoreValidLogMessage(instance_info,(string *)local_170,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_190,(string *)local_1b0);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_190);
      std::__cxx11::string::~string(local_170);
      std::allocator<char>::~allocator((allocator<char> *)&local_171);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_128);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"XrSecondaryViewConfigurationLayerInfoMSFT",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_200,"viewConfigurationType",&local_201);
    bVar1 = ValidateXrEnum(instance_info,command_name,(string *)local_1d8,(string *)local_200,
                           objects_info,value->viewConfigurationType);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator((allocator<char> *)&local_201);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_420,"XrSecondaryViewConfigurationLayerInfoMSFT",&local_421)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_448,"environmentBlendMode",&local_449);
      bVar1 = ValidateXrEnum(instance_info,command_name,(string *)local_420,(string *)local_448,
                             objects_info,value->environmentBlendMode);
      std::__cxx11::string::~string(local_448);
      std::allocator<char>::~allocator((allocator<char> *)&local_449);
      std::__cxx11::string::~string(local_420);
      std::allocator<char>::~allocator((allocator<char> *)&local_421);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        if ((value->layerCount == 0) && (value->layers != (XrCompositionLayerBaseHeader **)0x0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_668,
                     "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layerCount-arraylength",
                     &local_669);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_688,objects_info);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_6a8,
                     "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layerCount is non-optional and must be greater than 0"
                     ,&local_6a9);
          CoreValidLogMessage(instance_info,(string *)local_668,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,&local_688,(string *)local_6a8);
          std::__cxx11::string::~string(local_6a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_688);
          std::__cxx11::string::~string(local_668);
          std::allocator<char>::~allocator((allocator<char> *)&local_669);
          valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        }
        if ((value->layers == (XrCompositionLayerBaseHeader **)0x0) && (value->layerCount != 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_6d0,"VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                     &local_6d1);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_6f0,objects_info);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&value_layers_inc,
                     "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid NULL for XrCompositionLayerBaseHeader \"layers\" is which not optional since \"layerCount\" is set and must be non-NULL"
                     ,&local_711);
          CoreValidLogMessage(instance_info,(string *)local_6d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              command_name,&local_6f0,(string *)&value_layers_inc);
          std::__cxx11::string::~string((string *)&value_layers_inc);
          std::allocator<char>::~allocator((allocator<char> *)&local_711);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_6f0);
          std::__cxx11::string::~string(local_6d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
          instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        }
        else {
          if (value->layers != (XrCompositionLayerBaseHeader **)0x0) {
            for (local_718 = 0; local_718 < value->layerCount; local_718 = local_718 + 1) {
              if (value->layers[local_718] == (XrCompositionLayerBaseHeader *)0x0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_738,
                           "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                           &local_739);
                std::allocator<char>::~allocator((allocator<char> *)&local_739);
                std::__cxx11::string::operator+=(local_738,"[");
                std::__cxx11::to_string(local_760,local_718);
                std::__cxx11::string::operator+=(local_738,(string *)local_760);
                std::__cxx11::string::~string((string *)local_760);
                std::__cxx11::string::operator+=(local_738,"]");
                std::__cxx11::string::operator+=(local_738," is null");
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_780,
                           "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                           &local_781);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                        *)&new_compositionlayerprojection_value,objects_info);
                CoreValidLogMessage(instance_info,(string *)local_780,
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                    (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                     *)&new_compositionlayerprojection_value,(string *)local_738);
                std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
                ~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&new_compositionlayerprojection_value);
                std::__cxx11::string::~string(local_780);
                std::allocator<char>::~allocator((allocator<char> *)&local_781);
                std::__cxx11::string::~string(local_738);
                return XR_ERROR_VALIDATION_FAILURE;
              }
              if (value->layers[local_718]->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
                XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                         (XrCompositionLayerProjection *)value->layers[local_718]);
                if (XVar2 != XR_SUCCESS) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_7c8,
                             "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                             &local_7c9);
                  std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
                  std::__cxx11::string::operator+=(local_7c8,"[");
                  std::__cxx11::to_string(local_7f0,local_718);
                  std::__cxx11::string::operator+=(local_7c8,(string *)local_7f0);
                  std::__cxx11::string::~string((string *)local_7f0);
                  std::__cxx11::string::operator+=(local_7c8,"]");
                  std::__cxx11::string::operator+=(local_7c8," is invalid");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_810,
                             "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                             &local_811);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&new_compositionlayerquad_value,objects_info);
                  CoreValidLogMessage(instance_info,(string *)local_810,
                                      VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                      (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                       *)&new_compositionlayerquad_value,(string *)local_7c8);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&new_compositionlayerquad_value);
                  std::__cxx11::string::~string(local_810);
                  std::allocator<char>::~allocator((allocator<char> *)&local_811);
                  std::__cxx11::string::~string(local_7c8);
                  return XR_ERROR_VALIDATION_FAILURE;
                }
                valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
              }
              else if (value->layers[local_718]->type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
                XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                         (XrCompositionLayerQuad *)value->layers[local_718]);
                if (XVar2 != XR_SUCCESS) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_858,
                             "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                             &local_859);
                  std::allocator<char>::~allocator((allocator<char> *)&local_859);
                  std::__cxx11::string::operator+=(local_858,"[");
                  std::__cxx11::to_string(local_880,local_718);
                  std::__cxx11::string::operator+=(local_858,(string *)local_880);
                  std::__cxx11::string::~string((string *)local_880);
                  std::__cxx11::string::operator+=(local_858,"]");
                  std::__cxx11::string::operator+=(local_858," is invalid");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_8a0,
                             "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                             &local_8a1);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&new_compositionlayercubekhr_value,objects_info);
                  CoreValidLogMessage(instance_info,(string *)local_8a0,
                                      VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                      (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                       *)&new_compositionlayercubekhr_value,(string *)local_858);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&new_compositionlayercubekhr_value);
                  std::__cxx11::string::~string(local_8a0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_8a1);
                  std::__cxx11::string::~string(local_858);
                  return XR_ERROR_VALIDATION_FAILURE;
                }
                valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
              }
              else if (value->layers[local_718]->type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
                XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                         (XrCompositionLayerCubeKHR *)value->layers[local_718]);
                if (XVar2 != XR_SUCCESS) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_8e8,
                             "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                             &local_8e9);
                  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
                  std::__cxx11::string::operator+=(local_8e8,"[");
                  std::__cxx11::to_string(local_910,local_718);
                  std::__cxx11::string::operator+=(local_8e8,(string *)local_910);
                  std::__cxx11::string::~string((string *)local_910);
                  std::__cxx11::string::operator+=(local_8e8,"]");
                  std::__cxx11::string::operator+=(local_8e8," is invalid");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_930,
                             "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                             &local_931);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&new_compositionlayercylinderkhr_value,objects_info);
                  CoreValidLogMessage(instance_info,(string *)local_930,
                                      VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                      (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                       *)&new_compositionlayercylinderkhr_value,(string *)local_8e8)
                  ;
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&new_compositionlayercylinderkhr_value);
                  std::__cxx11::string::~string(local_930);
                  std::allocator<char>::~allocator((allocator<char> *)&local_931);
                  std::__cxx11::string::~string(local_8e8);
                  return XR_ERROR_VALIDATION_FAILURE;
                }
                valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
              }
              else if (value->layers[local_718]->type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
                XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                         (XrCompositionLayerCylinderKHR *)value->layers[local_718]);
                if (XVar2 != XR_SUCCESS) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_978,
                             "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                             &local_979);
                  std::allocator<char>::~allocator((allocator<char> *)&local_979);
                  std::__cxx11::string::operator+=(local_978,"[");
                  std::__cxx11::to_string(local_9a0,local_718);
                  std::__cxx11::string::operator+=(local_978,(string *)local_9a0);
                  std::__cxx11::string::~string((string *)local_9a0);
                  std::__cxx11::string::operator+=(local_978,"]");
                  std::__cxx11::string::operator+=(local_978," is invalid");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_9c0,
                             "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                             &local_9c1);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&new_compositionlayerequirectkhr_value,objects_info);
                  CoreValidLogMessage(instance_info,(string *)local_9c0,
                                      VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                      (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                       *)&new_compositionlayerequirectkhr_value,(string *)local_978)
                  ;
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&new_compositionlayerequirectkhr_value);
                  std::__cxx11::string::~string(local_9c0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
                  std::__cxx11::string::~string(local_978);
                  return XR_ERROR_VALIDATION_FAILURE;
                }
                valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
              }
              else if (value->layers[local_718]->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
                XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                         (XrCompositionLayerEquirectKHR *)value->layers[local_718]);
                if (XVar2 != XR_SUCCESS) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_a08,
                             "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                             &local_a09);
                  std::allocator<char>::~allocator((allocator<char> *)&local_a09);
                  std::__cxx11::string::operator+=(local_a08,"[");
                  std::__cxx11::to_string(local_a30,local_718);
                  std::__cxx11::string::operator+=(local_a08,(string *)local_a30);
                  std::__cxx11::string::~string((string *)local_a30);
                  std::__cxx11::string::operator+=(local_a08,"]");
                  std::__cxx11::string::operator+=(local_a08," is invalid");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_a50,
                             "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                             &local_a51);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&new_compositionlayerequirect2khr_value,objects_info);
                  CoreValidLogMessage(instance_info,(string *)local_a50,
                                      VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                      (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                       *)&new_compositionlayerequirect2khr_value,(string *)local_a08
                                     );
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&new_compositionlayerequirect2khr_value);
                  std::__cxx11::string::~string(local_a50);
                  std::allocator<char>::~allocator((allocator<char> *)&local_a51);
                  std::__cxx11::string::~string(local_a08);
                  return XR_ERROR_VALIDATION_FAILURE;
                }
                valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
              }
              else if (value->layers[local_718]->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
                XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                         (XrCompositionLayerEquirect2KHR *)value->layers[local_718])
                ;
                if (XVar2 != XR_SUCCESS) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_a98,
                             "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                             &local_a99);
                  std::allocator<char>::~allocator((allocator<char> *)&local_a99);
                  std::__cxx11::string::operator+=(local_a98,"[");
                  std::__cxx11::to_string(local_ac0,local_718);
                  std::__cxx11::string::operator+=(local_a98,(string *)local_ac0);
                  std::__cxx11::string::~string((string *)local_ac0);
                  std::__cxx11::string::operator+=(local_a98,"]");
                  std::__cxx11::string::operator+=(local_a98," is invalid");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_ae0,
                             "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                             &local_ae1);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&new_compositionlayerpassthroughfb_value,objects_info);
                  CoreValidLogMessage(instance_info,(string *)local_ae0,
                                      VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                      (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                       *)&new_compositionlayerpassthroughfb_value,
                                      (string *)local_a98);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&new_compositionlayerpassthroughfb_value);
                  std::__cxx11::string::~string(local_ae0);
                  std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
                  std::__cxx11::string::~string(local_a98);
                  return XR_ERROR_VALIDATION_FAILURE;
                }
                valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
              }
              else if (value->layers[local_718]->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
                XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                         (XrCompositionLayerPassthroughFB *)value->layers[local_718]
                                        );
                if (XVar2 != XR_SUCCESS) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_b28,
                             "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                             &local_b29);
                  std::allocator<char>::~allocator((allocator<char> *)&local_b29);
                  std::__cxx11::string::operator+=(local_b28,"[");
                  std::__cxx11::to_string(local_b50,local_718);
                  std::__cxx11::string::operator+=(local_b28,(string *)local_b50);
                  std::__cxx11::string::~string((string *)local_b50);
                  std::__cxx11::string::operator+=(local_b28,"]");
                  std::__cxx11::string::operator+=(local_b28," is invalid");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_b70,
                             "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                             &local_b71);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                            *)&new_compositionlayerpassthroughhtc_value,objects_info);
                  CoreValidLogMessage(instance_info,(string *)local_b70,
                                      VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                                      (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                                       *)&new_compositionlayerpassthroughhtc_value,
                                      (string *)local_b28);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::~vector((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)&new_compositionlayerpassthroughhtc_value);
                  std::__cxx11::string::~string(local_b70);
                  std::allocator<char>::~allocator((allocator<char> *)&local_b71);
                  std::__cxx11::string::~string(local_b28);
                  return XR_ERROR_VALIDATION_FAILURE;
                }
                valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
              }
              else if (value->layers[local_718]->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC)
              {
                XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                         (XrCompositionLayerPassthroughHTC *)
                                         value->layers[local_718]);
                if (XVar2 != XR_SUCCESS) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_bb8,
                             "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers",
                             &local_bb9);
                  std::allocator<char>::~allocator((allocator<char> *)&local_bb9);
                  std::__cxx11::string::operator+=(local_bb8,"[");
                  std::__cxx11::to_string(local_be0,local_718);
                  std::__cxx11::string::operator+=(local_bb8,(string *)local_be0);
                  std::__cxx11::string::~string((string *)local_be0);
                  std::__cxx11::string::operator+=(local_bb8,"]");
                  std::__cxx11::string::operator+=(local_bb8," is invalid");
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_c00,
                             "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                             &local_c01);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::vector(&local_c20,objects_info);
                  CoreValidLogMessage(instance_info,(string *)local_c00,
                                      VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_c20,
                                      (string *)local_bb8);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::~vector(&local_c20);
                  std::__cxx11::string::~string(local_c00);
                  std::allocator<char>::~allocator((allocator<char> *)&local_c01);
                  std::__cxx11::string::~string(local_bb8);
                  return XR_ERROR_VALIDATION_FAILURE;
                }
                valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
              }
              else {
                valid_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ =
                     ValidateXrStruct(instance_info,command_name,objects_info,check_members,true,
                                      value->layers[local_718]);
                if (valid_ext_structs.
                    super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_ != XR_SUCCESS) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_c40,
                             "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                             &local_c41);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::vector(&local_c60,objects_info);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            (local_c80,
                             "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers is invalid"
                             ,&local_c81);
                  CoreValidLogMessage(instance_info,(string *)local_c40,
                                      VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,&local_c60,
                                      (string *)local_c80);
                  std::__cxx11::string::~string(local_c80);
                  std::allocator<char>::~allocator((allocator<char> *)&local_c81);
                  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                  ::~vector(&local_c60);
                  std::__cxx11::string::~string(local_c40);
                  std::allocator<char>::~allocator((allocator<char> *)&local_c41);
                  return valid_ext_structs.
                         super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
                }
              }
            }
          }
          instance_info_local._4_4_ =
               valid_ext_structs.
               super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_5c8);
        std::operator<<((ostream *)local_5c8,
                        "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid XrEnvironmentBlendMode \"environmentBlendMode\" enum value "
                       );
        Uint32ToHexString_abi_cxx11_((uint32_t)local_5e8);
        std::operator<<((ostream *)local_5c8,local_5e8);
        std::__cxx11::string::~string(local_5e8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_608,
                   "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-environmentBlendMode-parameter",
                   &local_609);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_628,objects_info);
        std::__cxx11::ostringstream::str();
        CoreValidLogMessage(instance_info,(string *)local_608,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            command_name,&local_628,local_648);
        std::__cxx11::string::~string((string *)local_648);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_628);
        std::__cxx11::string::~string(local_608);
        std::allocator<char>::~allocator((allocator<char> *)&local_609);
        instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
        std::__cxx11::ostringstream::~ostringstream(local_5c8);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_380);
      std::operator<<((ostream *)local_380,
                      "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid XrViewConfigurationType \"viewConfigurationType\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_((uint32_t)local_3a0);
      std::operator<<((ostream *)local_380,local_3a0);
      std::__cxx11::string::~string(local_3a0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3c0,
                 "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-viewConfigurationType-parameter",
                 &local_3c1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_3e0,objects_info);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(instance_info,(string *)local_3c0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_3e0,local_400);
      std::__cxx11::string::~string((string *)local_400);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_3e0);
      std::__cxx11::string::~string(local_3c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::ostringstream::~ostringstream(local_380);
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSecondaryViewConfigurationLayerInfoMSFT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSecondaryViewConfigurationLayerInfoMSFT",
                             value->type, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-type-type", XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT, "XR_TYPE_SECONDARY_VIEW_CONFIGURATION_LAYER_INFO_MSFT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSecondaryViewConfigurationLayerInfoMSFT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSecondaryViewConfigurationLayerInfoMSFT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSecondaryViewConfigurationLayerInfoMSFT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrViewConfigurationType value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrSecondaryViewConfigurationLayerInfoMSFT", "viewConfigurationType", objects_info, value->viewConfigurationType)) {
        std::ostringstream oss_enum;
        oss_enum << "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid XrViewConfigurationType \"viewConfigurationType\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->viewConfigurationType));
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-viewConfigurationType-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Make sure the enum type XrEnvironmentBlendMode value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrSecondaryViewConfigurationLayerInfoMSFT", "environmentBlendMode", objects_info, value->environmentBlendMode)) {
        std::ostringstream oss_enum;
        oss_enum << "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid XrEnvironmentBlendMode \"environmentBlendMode\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->environmentBlendMode));
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-environmentBlendMode-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Non-optional array length must be non-zero
    if (0 >= value->layerCount && nullptr != value->layers) {
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layerCount-arraylength",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info,
                            "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layerCount is non-optional and must be greater than 0");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    // Pointer/array variable with a length variable.  Make sure that
    // if length variable is non-zero that the pointer is not NULL
    if (nullptr == value->layers && 0 != value->layerCount) {
        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name, objects_info,
                            "XrSecondaryViewConfigurationLayerInfoMSFT contains invalid NULL for XrCompositionLayerBaseHeader \"layers\" is which not "
                            "optional since \"layerCount\" is set and must be non-NULL");
        return XR_ERROR_VALIDATION_FAILURE;
    }
    if (value->layers) {
        for (uint32_t value_layers_inc = 0; value_layers_inc < value->layerCount; ++value_layers_inc) {
            if (value->layers[value_layers_inc] == nullptr) {
                std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                error_message += "[";
                error_message += std::to_string(value_layers_inc);
                error_message += "]";
                error_message += " is null";
                CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    error_message);
                return XR_ERROR_VALIDATION_FAILURE;
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerProjection and it is valid
            {
                const XrCompositionLayerProjection* const* new_compositionlayerprojection_value = reinterpret_cast<const XrCompositionLayerProjection* const*>(value->layers);
                if (new_compositionlayerprojection_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PROJECTION) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerprojection_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerQuad and it is valid
            {
                const XrCompositionLayerQuad* const* new_compositionlayerquad_value = reinterpret_cast<const XrCompositionLayerQuad* const*>(value->layers);
                if (new_compositionlayerquad_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_QUAD) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerquad_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCubeKHR and it is valid
            {
                const XrCompositionLayerCubeKHR* const* new_compositionlayercubekhr_value = reinterpret_cast<const XrCompositionLayerCubeKHR* const*>(value->layers);
                if (new_compositionlayercubekhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_CUBE_KHR) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayercubekhr_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerCylinderKHR and it is valid
            {
                const XrCompositionLayerCylinderKHR* const* new_compositionlayercylinderkhr_value = reinterpret_cast<const XrCompositionLayerCylinderKHR* const*>(value->layers);
                if (new_compositionlayercylinderkhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_CYLINDER_KHR) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayercylinderkhr_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirectKHR and it is valid
            {
                const XrCompositionLayerEquirectKHR* const* new_compositionlayerequirectkhr_value = reinterpret_cast<const XrCompositionLayerEquirectKHR* const*>(value->layers);
                if (new_compositionlayerequirectkhr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT_KHR) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerequirectkhr_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerEquirect2KHR and it is valid
            {
                const XrCompositionLayerEquirect2KHR* const* new_compositionlayerequirect2khr_value = reinterpret_cast<const XrCompositionLayerEquirect2KHR* const*>(value->layers);
                if (new_compositionlayerequirect2khr_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_EQUIRECT2_KHR) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerequirect2khr_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughFB and it is valid
            {
                const XrCompositionLayerPassthroughFB* const* new_compositionlayerpassthroughfb_value = reinterpret_cast<const XrCompositionLayerPassthroughFB* const*>(value->layers);
                if (new_compositionlayerpassthroughfb_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_FB) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerpassthroughfb_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate if XrCompositionLayerBaseHeader is a child structure of type XrCompositionLayerPassthroughHTC and it is valid
            {
                const XrCompositionLayerPassthroughHTC* const* new_compositionlayerpassthroughhtc_value = reinterpret_cast<const XrCompositionLayerPassthroughHTC* const*>(value->layers);
                if (new_compositionlayerpassthroughhtc_value[value_layers_inc]->type == XR_TYPE_COMPOSITION_LAYER_PASSTHROUGH_HTC) {
                    xr_result = ValidateXrStruct(instance_info, command_name,
                                                                    objects_info, check_members, true, new_compositionlayerpassthroughhtc_value[value_layers_inc]);
                    if (XR_SUCCESS != xr_result) {
                        std::string error_message = "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers";
                        error_message += "[";
                        error_message += std::to_string(value_layers_inc);
                        error_message += "]";
                        error_message += " is invalid";
                        CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                            objects_info,
                                            error_message);
                        return XR_ERROR_VALIDATION_FAILURE;
                        break;
                    } else {
                        continue;
                    }
                }
            }
            // Validate that the base-structure XrCompositionLayerBaseHeader is valid
            xr_result = ValidateXrStruct(instance_info, command_name, objects_info,
                                                             check_members, true, value->layers[value_layers_inc]);
            if (XR_SUCCESS != xr_result) {
                CoreValidLogMessage(instance_info, "VUID-XrSecondaryViewConfigurationLayerInfoMSFT-layers-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                    objects_info,
                                    "Structure XrSecondaryViewConfigurationLayerInfoMSFT member layers is invalid");
                return xr_result;
            }
        }
    }
    // Everything checked out properly
    return xr_result;
}